

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::ProcessLinkFailedAsmJsModule(InterpreterStackFrame *this)

{
  void *returnAddress;
  void *addressOfReturnAddress;
  DynamicProfileInfo *this_00;
  Var *allocation_00;
  Var *stackAllocation_00;
  ByteCodeReader *this_01;
  uint startOffset;
  InterpreterStackFrame *pIVar1;
  undefined8 uVar2;
  Var **pppvVar3;
  ScriptFunction *pSVar4;
  bool bVar5;
  ExecutionMode EVar6;
  bool initParams;
  ImplicitCallFlags flags;
  FunctionBody *pFVar7;
  ScriptContext *pSVar8;
  ThreadContext *pTVar9;
  long lVar10;
  Var **pppvVar11;
  PVOID unaff_retaddr;
  Var *local_198;
  ScriptContext *local_190;
  ImplicitCallFlags local_181;
  ThreadContext *local_180;
  DynamicProfileInfo *local_178;
  ScriptContext *local_170;
  Var *local_168;
  Var *local_160;
  ByteCodeReader *local_158;
  uint local_14c;
  Var *local_148;
  ThreadContext *local_140;
  Var *local_138;
  ThreadContext *local_130;
  size_t local_128;
  bool local_11a;
  bool local_119;
  InterpreterStackFrame *local_118;
  Var *local_100;
  Var retVal;
  PushPopFrameHelper pushPopFrameHelper;
  InterpreterStackFrame *newInstance;
  Var invalidStackVar;
  size_t stackVarSizeInBytes;
  ArenaAllocator *tmpAlloc;
  Var **pppvStack_b8;
  bool fReleaseAlloc;
  DWORD_PTR stackAddr;
  Var *stackAllocation;
  Var *allocation;
  size_t varSizeInBytes;
  size_t stackVarAllocCount;
  size_t varAllocCount;
  Setup setup;
  DynamicProfileInfo *dynamicProfileInfo;
  ScriptFunction *pSStack_38;
  bool doProfile;
  ScriptFunction *funcObj;
  AsmJsModuleInfo *info;
  FunctionBody *asmJsModuleFunctionBody;
  InterpreterStackFrame *this_local;
  size_t local_10;
  
  pppvVar11 = &local_198;
  local_118 = this;
  asmJsModuleFunctionBody = (FunctionBody *)this;
  AsmJSCompiler::OutputError(*(ScriptContext **)(this + 0x78),L"asm.js linking failed.");
  info = (AsmJsModuleInfo *)GetFunctionBody(local_118);
  funcObj = (ScriptFunction *)FunctionBody::GetAsmJsModuleInfo((FunctionBody *)info);
  bVar5 = AsmJsModuleInfo::IsRuntimeProcessed((AsmJsModuleInfo *)funcObj);
  if (bVar5) {
    Throw::OutOfMemory();
  }
  pSStack_38 = GetJavascriptFunction(local_118);
  JavascriptFunction::ReparseAsmJsModule(&stack0xffffffffffffffc8);
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSStack_38);
  EVar6 = FunctionBody::GetInterpreterExecutionMode(pFVar7,false);
  local_119 = true;
  if (EVar6 != ProfilingInterpreter) {
    pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSStack_38);
    bVar5 = FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar7);
    local_11a = false;
    if (bVar5) {
      pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSStack_38);
      local_11a = DynamicProfileInfo::IsEnabled(pFVar7);
    }
    local_119 = local_11a;
  }
  bVar5 = local_119;
  setup.bailedOut = false;
  setup.bailedOutOfInlinee = false;
  setup.isGeneratorFrame = false;
  setup._59_5_ = 0;
  if (local_119 != false) {
    pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSStack_38);
    setup._56_8_ = FunctionBody::GetDynamicProfileInfo(pFVar7);
    pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)pSStack_38);
    pTVar9 = ScriptContext::GetThreadContext(pSVar8);
    ThreadContext::ClearImplicitCallFlags(pTVar9);
  }
  Setup::Setup((Setup *)&varAllocCount,pSStack_38,*(Var **)(local_118 + 0x20),
               *(int *)(local_118 + 0x18));
  stackVarAllocCount = Setup::GetAllocationVarCount((Setup *)&varAllocCount);
  varSizeInBytes = Setup::GetStackAllocationVarCount((Setup *)&varAllocCount);
  stackAllocation = (Var *)0x0;
  stackAddr = 0;
  tmpAlloc._7_1_ = 0;
  if (stackVarAllocCount + varSizeInBytes < 0x8001) {
    allocation = (Var *)((stackVarAllocCount + varSizeInBytes) * 8);
    pSVar8 = GetScriptContext(local_118);
    local_140 = ScriptContext::GetThreadContext(pSVar8);
    local_138 = allocation + 0x800;
    pSVar8 = GetScriptContext(local_118);
    ThreadContext::ProbeStack(local_140,(size_t)local_138,pSVar8,unaff_retaddr);
    pppvVar11 = (Var **)((long)&local_198 - ((long)allocation + 0xfU & 0xfffffffffffffff0));
    pppvStack_b8 = pppvVar11;
    stackAllocation = pppvVar11;
  }
  else {
    stackVarSizeInBytes = 0;
    pSVar8 = GetScriptContext(local_118);
    tmpAlloc._7_1_ =
         ScriptContext::EnsureInterpreterArena(pSVar8,(ArenaAllocator **)&stackVarSizeInBytes);
    allocation = (Var *)(stackVarAllocCount << 3);
    local_10 = stackVarSizeInBytes;
    this_local = (InterpreterStackFrame *)allocation;
    stackAllocation =
         (Var *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              stackVarSizeInBytes,(size_t)allocation);
    if (varSizeInBytes != 0) {
      lVar10 = varSizeInBytes * 8;
      pSVar8 = GetScriptContext(local_118);
      local_130 = ScriptContext::GetThreadContext(pSVar8);
      local_128 = lVar10 + 0x4000;
      pSVar8 = GetScriptContext(local_118);
      ThreadContext::ProbeStack(local_130,local_128,pSVar8,unaff_retaddr);
      pppvVar11 = (Var **)((long)&local_198 - (lVar10 + 0xfU & 0xfffffffffffffff0));
      stackAddr = (DWORD_PTR)pppvVar11;
    }
    pppvStack_b8 = &stackAllocation;
  }
  pppvVar11[-2] = (Var *)0xfefefefefefefefe;
  pppvVar11[-1] = (Var *)0xfefefefefefefefe;
  pSVar4 = pSStack_38;
  local_168 = stackAllocation;
  local_160 = (Var *)stackAddr;
  pppvVar11[-3] = (Var *)0xde838c;
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar4);
  pppvVar11[-3] = (Var *)0xde8394;
  initParams = ParseableFunctionInfo::GetHasImplicitArgIns(&pFVar7->super_ParseableFunctionInfo);
  pppvVar3 = pppvStack_b8;
  stackAllocation_00 = local_160;
  allocation_00 = local_168;
  pppvVar11[-3] = pppvVar11 + -2;
  pppvVar11[-4] = pppvVar3;
  local_14c = 0;
  pppvVar11[-5] = (Var *)0xde83de;
  local_158 = (ByteCodeReader *)
              Setup::InitializeAllocation
                        ((Setup *)&varAllocCount,allocation_00,stackAllocation_00,initParams,bVar5,
                         (LoopHeader *)0x0,(DWORD_PTR)pppvVar11[-4],pppvVar11[-3]);
  pSVar4 = pSStack_38;
  pushPopFrameHelper._16_8_ = local_158;
  pppvVar11[-3] = (Var *)0xde8400;
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar4);
  startOffset = local_14c;
  this_01 = local_158;
  pppvVar11[-3] = (Var *)0xde8415;
  ByteCodeReader::Create(this_01,pFVar7,startOffset);
  pSVar4 = pSStack_38;
  pppvVar11[-3] = (Var *)0xde841e;
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar4);
  pppvVar11[-3] = (Var *)0xde8426;
  FunctionBody::BeginExecution(pFVar7);
  uVar2 = pushPopFrameHelper._16_8_;
  returnAddress = *(void **)(local_118 + 0x98);
  addressOfReturnAddress = *(void **)(local_118 + 0xa0);
  pppvVar11[-3] = (Var *)0xde844e;
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)&retVal,(InterpreterStackFrame *)uVar2,returnAddress,
             addressOfReturnAddress);
  uVar2 = pushPopFrameHelper._16_8_;
  pppvVar11[-3] = (Var *)0xde845a;
  local_148 = (Var *)ProcessUnprofiled((InterpreterStackFrame *)uVar2);
  pIVar1 = local_118;
  local_100 = local_148;
  if (bVar5 != false) {
    local_178 = (DynamicProfileInfo *)setup._56_8_;
    pppvVar11[-3] = (Var *)0xde8492;
    pSVar8 = GetScriptContext(pIVar1);
    local_170 = pSVar8;
    pppvVar11[-3] = (Var *)0xde84a7;
    pTVar9 = ScriptContext::GetThreadContext(pSVar8);
    local_180 = pTVar9;
    pppvVar11[-3] = (Var *)0xde84bc;
    flags = ThreadContext::GetImplicitCallFlags(pTVar9);
    this_00 = local_178;
    local_181 = flags;
    pppvVar11[-3] = (Var *)0xde84d9;
    DynamicProfileInfo::RecordImplicitCallFlags(this_00,flags);
  }
  pIVar1 = local_118;
  if ((tmpAlloc._7_1_ & 1) != 0) {
    pppvVar11[-3] = (Var *)0xde8512;
    pSVar8 = GetScriptContext(pIVar1);
    local_190 = pSVar8;
    pppvVar11[-3] = (Var *)0xde8527;
    ScriptContext::ReleaseInterpreterArena(pSVar8);
  }
  local_198 = local_100;
  pppvVar11[-3] = (Var *)0xde8545;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)&retVal);
  return local_198;
}

Assistant:

Var InterpreterStackFrame::ProcessLinkFailedAsmJsModule()
    {
        AsmJSCompiler::OutputError(this->scriptContext, _u("asm.js linking failed."));

        Js::FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

        // do not support relinking with failed relink
        if (info->IsRuntimeProcessed())
        {
            Js::Throw::OutOfMemory();
        }

        ScriptFunction * funcObj = GetJavascriptFunction();
        ScriptFunction::ReparseAsmJsModule(&funcObj);
        const bool doProfile =
            funcObj->GetFunctionBody()->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (funcObj->GetFunctionBody()->IsInDebugMode() && DynamicProfileInfo::IsEnabled(funcObj->GetFunctionBody()));

        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (doProfile)
        {
            dynamicProfileInfo = funcObj->GetFunctionBody()->GetDynamicProfileInfo();
            funcObj->GetScriptContext()->GetThreadContext()->ClearImplicitCallFlags();
        }

        // after reparsing, we want to also use a new interpreter stack frame, as it will have different characteristics than the asm.js version
        InterpreterStackFrame::Setup setup(funcObj, m_inParams, m_inSlotsCount);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;

        Var* allocation = nullptr;
        Var* stackAllocation = nullptr;
        DWORD_PTR stackAddr;
        bool fReleaseAlloc = false;
        if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = GetScriptContext()->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Var);
            allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
            }
            // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
            // debugger stepping does not matter here, but it's worth being consistent with normal stack frame
            stackAddr = reinterpret_cast<DWORD_PTR>(&allocation);
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
            PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(GetScriptContext(), Js::Constants::MinStackInterpreter + varSizeInBytes);
            allocation = (Var*)_alloca(varSizeInBytes);
            stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
        }

#if DBG
        Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        InterpreterStackFrame * newInstance = setup.InitializeAllocation(allocation, stackAllocation, funcObj->GetFunctionBody()->GetHasImplicitArgIns(), doProfile, nullptr, stackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(funcObj->GetFunctionBody());
        // now that we have set up the new frame, let's interpret it!
        funcObj->GetFunctionBody()->BeginExecution();

        PushPopFrameHelper pushPopFrameHelper(newInstance, this->returnAddress, this->addressOfReturnAddress);
        Var retVal = newInstance->ProcessUnprofiled();

        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(GetScriptContext()->GetThreadContext()->GetImplicitCallFlags());
        }

        if (fReleaseAlloc)
        {
            GetScriptContext()->ReleaseInterpreterArena();
        }

        return retVal;
    }